

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestT<unsigned_char>(void)

{
  ComparisonTestTU<unsigned_char,char>();
  ComparisonTestTU<unsigned_char,signed_char>();
  ComparisonTestTU<unsigned_char,unsigned_char>();
  ComparisonTestTU<unsigned_char,short>();
  ComparisonTestTU<unsigned_char,unsigned_short>();
  ComparisonTestTU<unsigned_char,int>();
  ComparisonTestTU<unsigned_char,unsigned_int>();
  ComparisonTestTU<unsigned_char,long>();
  ComparisonTestTU<unsigned_char,unsigned_long>();
  ComparisonTestTU<unsigned_char,long_long>();
  ComparisonTestTU<unsigned_char,unsigned_long_long>();
  return;
}

Assistant:

void ComparisonTestT()
	{
		ComparisonTestTU<T, char>();
		ComparisonTestTU<T, signed char>();
		ComparisonTestTU<T, unsigned char>();
		ComparisonTestTU<T, signed short>();
		ComparisonTestTU<T, unsigned short>();
		ComparisonTestTU<T, signed int>();
		ComparisonTestTU<T, unsigned int>();
		ComparisonTestTU<T, signed long>();
		ComparisonTestTU<T, unsigned long>();
		ComparisonTestTU<T, signed long long>();
		ComparisonTestTU<T, unsigned long long>();
	}